

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_example.cc
# Opt level: O2

void DumpTextureInfo(TextureInfo *texinfo,int indent)

{
  ostream *poVar1;
  allocator local_61;
  string local_60;
  string local_40;
  
  Indent_abi_cxx11_(&local_60,indent);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_60);
  poVar1 = std::operator<<(poVar1,"index     : ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,texinfo->index);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  Indent_abi_cxx11_(&local_60,indent);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_60);
  poVar1 = std::operator<<(poVar1,"texCoord  : TEXCOORD_");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,texinfo->texCoord);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  DumpExtensions(&texinfo->extensions,indent + 1);
  std::__cxx11::string::string((string *)&local_40,"extras",&local_61);
  PrintValue(&local_60,&local_40,&texinfo->extras,indent + 1,true);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_60);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if ((texinfo->extensions_json_string)._M_string_length != 0) {
    Indent_abi_cxx11_(&local_60,indent);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_60);
    poVar1 = std::operator<<(poVar1,"extensions(JSON string) = ");
    poVar1 = std::operator<<(poVar1,(string *)&texinfo->extensions_json_string);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((texinfo->extras_json_string)._M_string_length != 0) {
    Indent_abi_cxx11_(&local_60,indent);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_60);
    poVar1 = std::operator<<(poVar1,"extras(JSON string) = ");
    poVar1 = std::operator<<(poVar1,(string *)&texinfo->extras_json_string);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

static void DumpTextureInfo(const tinygltf::TextureInfo &texinfo,
                            const int indent) {
  std::cout << Indent(indent) << "index     : " << texinfo.index << "\n";
  std::cout << Indent(indent) << "texCoord  : TEXCOORD_" << texinfo.texCoord
            << "\n";
  DumpExtensions(texinfo.extensions, indent + 1);
  std::cout << PrintValue("extras", texinfo.extras, indent + 1) << "\n";

  if (!texinfo.extensions_json_string.empty()) {
    std::cout << Indent(indent)
              << "extensions(JSON string) = " << texinfo.extensions_json_string
              << "\n";
  }

  if (!texinfo.extras_json_string.empty()) {
    std::cout << Indent(indent)
              << "extras(JSON string) = " << texinfo.extras_json_string << "\n";
  }
}